

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::autoPartitionPartialsOperations
          (BeagleCPUImpl<double,_1,_1> *this,int *operations,int *partitionOperations,int count,
          int cumulativeScaleIndex)

{
  int k;
  int j;
  int i;
  int numOpsP;
  int numOps;
  int cumulativeScaleIndex_local;
  int count_local;
  int *partitionOperations_local;
  int *operations_local;
  BeagleCPUImpl<double,_1,_1> *this_local;
  
  for (i = 0; i < count; i = i + 1) {
    for (j = 0; j < this->kPartitionCount; j = j + 1) {
      for (k = 0; k < 7; k = k + 1) {
        partitionOperations[i * this->kPartitionCount * 9 + j * 9 + k] = operations[i * 7 + k];
      }
      partitionOperations[i * this->kPartitionCount * 9 + j * 9 + 7] = j;
      partitionOperations[i * this->kPartitionCount * 9 + j * 9 + 8] = cumulativeScaleIndex;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::autoPartitionPartialsOperations(const int* operations,
                                                                        int* partitionOperations,
                                                                        int count,
                                                                        int cumulativeScaleIndex) {

    int numOps  = BEAGLE_OP_COUNT;
    int numOpsP = BEAGLE_PARTITION_OP_COUNT;

    for (int i=0; i<count; i++) {
        for (int j=0; j<kPartitionCount; j++) {
            for (int k=0; k<numOps; k++) {
                partitionOperations[i*kPartitionCount*numOpsP + j*numOpsP + k] = operations[i*numOps + k];
            }
                partitionOperations[i*kPartitionCount*numOpsP + j*numOpsP + numOps    ] = j;
                partitionOperations[i*kPartitionCount*numOpsP + j*numOpsP + numOps + 1] = cumulativeScaleIndex;
        }
    }
}